

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall icu_63::SimpleTimeZone::decodeStartRule(SimpleTimeZone *this,UErrorCode *status)

{
  char cVar1;
  char cVar2;
  EMode EVar3;
  bool bVar4;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    cVar1 = this->startDay;
    bVar4 = this->endDay != '\0';
    this->useDaylight = bVar4 && cVar1 != '\0';
    if ((bVar4 && cVar1 != '\0') && (this->dstSavings == 0)) {
      this->dstSavings = 3600000;
    }
    if (cVar1 != '\0') {
      if (((0xb < (ulong)(byte)this->startMonth) || (86400000 < (uint)this->startTime)) ||
         (UTC_TIME < this->startTimeMode)) {
LAB_001f57f6:
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
      }
      cVar2 = this->startDayOfWeek;
      if (cVar2 == '\0') {
        this->startMode = DOM_MODE;
      }
      else {
        EVar3 = DOW_IN_MONTH_MODE;
        if (cVar2 < '\x01') {
          this->startDayOfWeek = -cVar2;
          EVar3 = DOW_GE_DOM_MODE;
          if (cVar1 < '\x01') {
            this->startDay = -cVar1;
            EVar3 = DOW_LE_DOM_MODE;
          }
        }
        this->startMode = EVar3;
        if ('\a' < this->startDayOfWeek) goto LAB_001f57f6;
      }
      cVar1 = this->startDay;
      if (this->startMode == DOW_IN_MONTH_MODE) {
        if ((byte)(cVar1 - 6U) < 0xf5) goto LAB_001f57f6;
      }
      else if ((cVar1 < '\x01') || ((char)STATICMONTHLENGTH[(byte)this->startMonth] < cVar1))
      goto LAB_001f57f6;
    }
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }